

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall Clasp::ReduceParams::disable(ReduceParams *this)

{
  undefined8 *in_RDI;
  Range<unsigned_int> local_30;
  ScheduleStrategy local_28;
  ScheduleStrategy local_18;
  
  local_18 = ScheduleStrategy::none();
  *in_RDI = local_18._0_8_;
  in_RDI[1] = local_18._8_8_;
  local_28 = ScheduleStrategy::none();
  in_RDI[2] = local_28._0_8_;
  in_RDI[3] = local_28._8_8_;
  *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 0xfffc07ff;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  Range<unsigned_int>::Range(&local_30,0xffffffff,0xffffffff);
  *(Range<unsigned_int> *)(in_RDI + 6) = local_30;
  *(undefined4 *)(in_RDI + 7) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  return;
}

Assistant:

void ReduceParams::disable() {
	cflSched  = ScheduleStrategy::none();
	growSched = ScheduleStrategy::none();
	strategy.fReduce = 0;
	fGrow     = 0.0f; fInit = 0.0f; fMax = 0.0f;
	initRange = Range<uint32>(UINT32_MAX, UINT32_MAX);
	maxRange  = UINT32_MAX;
	memMax    = 0;
}